

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void hrec_add_idx(bcf_hrec_t *hrec,int idx)

{
  size_t __size;
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  char buf [16];
  undefined8 uStack_40;
  byte local_38 [24];
  
  lVar7 = (long)hrec->nkeys;
  hrec->nkeys = hrec->nkeys + 1;
  __size = lVar7 * 8 + 8;
  uStack_40 = 0x118283;
  ppcVar2 = (char **)realloc(hrec->keys,__size);
  hrec->keys = ppcVar2;
  uStack_40 = 0x118293;
  ppcVar2 = (char **)realloc(hrec->vals,__size);
  hrec->vals = ppcVar2;
  uStack_40 = 0x1182a3;
  pcVar3 = strdup("IDX");
  hrec->keys[lVar7] = pcVar3;
  uVar4 = (ulong)(uint)-idx;
  if (0 < idx) {
    uVar4 = (ulong)(uint)idx;
  }
  uVar6 = 0;
  do {
    uVar1 = (uint)uVar4;
    local_38[uVar6] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
    uVar6 = uVar6 + 1;
    uVar4 = uVar4 / 10;
  } while (9 < uVar1);
  if (idx < 0) {
    uVar4 = uVar6 & 0xffffffff;
    uVar6 = (ulong)((int)uVar6 + 1);
    local_38[uVar4] = 0x2d;
  }
  uVar4 = (long)(int)uVar6 + 1;
  uVar4 = uVar4 >> 1 | uVar4;
  uVar4 = uVar4 >> 2 | uVar4;
  uVar4 = uVar4 >> 4 | uVar4;
  uVar4 = uVar4 >> 8 | uVar4;
  uStack_40 = 0x11832d;
  pcVar3 = (char *)malloc((uVar4 >> 0x10 | uVar4) + 1);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar4 = 1;
    if (1 < (int)uVar6) {
      uVar4 = uVar6 & 0xffffffff;
    }
    pbVar5 = local_38 + ((uVar6 & 0xffffffff) - 1);
    uVar6 = 0;
    do {
      pcVar3[uVar6] = *pbVar5;
      uVar6 = uVar6 + 1;
      pbVar5 = pbVar5 + -1;
    } while (uVar4 != uVar6);
    pcVar3[uVar6] = '\0';
  }
  hrec->vals[lVar7] = pcVar3;
  return;
}

Assistant:

void hrec_add_idx(bcf_hrec_t *hrec, int idx)
{
    int n = ++hrec->nkeys;
    hrec->keys = (char**) realloc(hrec->keys, sizeof(char*)*n);
    hrec->vals = (char**) realloc(hrec->vals, sizeof(char*)*n);
    hrec->keys[n-1] = strdup("IDX");
    kstring_t str = {0,0,0};
    kputw(idx, &str);
    hrec->vals[n-1] = str.s;
}